

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

void png_ascii_from_fixed(png_const_structrp png_ptr,png_charp ascii,size_t size,png_fixed_point fp)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  char digits [10];
  char acStack_2b [11];
  
  if (size < 0xd) {
    png_error(png_ptr,"ASCII conversion buffer too small");
  }
  if (fp < 0) {
    *ascii = '-';
    ascii = ascii + 1;
    fp = -fp;
LAB_0010c1a9:
    uVar3 = 0x10;
    uVar2 = 0;
    do {
      uVar6 = (int)uVar2 + 1;
      uVar7 = (ulong)uVar6;
      acStack_2b[uVar2 + 1] = (char)((uint)fp % 10) + '0';
      uVar4 = uVar3;
      if ((uint)fp % 10 != 0) {
        uVar4 = uVar6;
      }
      if (uVar3 != 0x10) {
        uVar4 = uVar3;
      }
      uVar3 = uVar4;
      bVar1 = 9 < (uint)fp;
      uVar2 = uVar7;
      fp = (uint)fp / 10;
    } while (bVar1);
    if (uVar6 != 0) {
      if (5 < uVar6) {
        uVar2 = (ulong)uVar6;
        do {
          pcVar5 = acStack_2b + uVar2;
          uVar2 = uVar2 - 1;
          *ascii = *pcVar5;
          ascii = ascii + 1;
        } while (5 < uVar2);
        uVar7 = 5;
      }
      if (uVar3 < 6) {
        *ascii = '.';
        pcVar5 = ascii + 1;
        if ((uint)uVar7 < 5) {
          uVar2 = (ulong)(4 - (uint)uVar7);
          memset(pcVar5,0x30,uVar2 + 1);
          pcVar5 = ascii + uVar2 + 2;
        }
        while (ascii = pcVar5, uVar3 <= (uint)uVar7) {
          uVar7 = (ulong)((uint)uVar7 - 1);
          *pcVar5 = acStack_2b[uVar7 + 1];
          pcVar5 = pcVar5 + 1;
        }
      }
      goto LAB_0010c267;
    }
  }
  else if (fp != 0) goto LAB_0010c1a9;
  *ascii = '0';
  ascii = ascii + 1;
LAB_0010c267:
  *ascii = '\0';
  return;
}

Assistant:

void /* PRIVATE */
png_ascii_from_fixed(png_const_structrp png_ptr, png_charp ascii,
    size_t size, png_fixed_point fp)
{
   /* Require space for 10 decimal digits, a decimal point, a minus sign and a
    * trailing \0, 13 characters:
    */
   if (size > 12)
   {
      png_uint_32 num;

      /* Avoid overflow here on the minimum integer. */
      if (fp < 0)
      {
         *ascii++ = 45; num = (png_uint_32)(-fp);
      }
      else
         num = (png_uint_32)fp;

      if (num <= 0x80000000) /* else overflowed */
      {
         unsigned int ndigits = 0, first = 16 /* flag value */;
         char digits[10];

         while (num)
         {
            /* Split the low digit off num: */
            unsigned int tmp = num/10;
            num -= tmp*10;
            digits[ndigits++] = (char)(48 + num);
            /* Record the first non-zero digit, note that this is a number
             * starting at 1, it's not actually the array index.
             */
            if (first == 16 && num > 0)
               first = ndigits;
            num = tmp;
         }

         if (ndigits > 0)
         {
            while (ndigits > 5) *ascii++ = digits[--ndigits];
            /* The remaining digits are fractional digits, ndigits is '5' or
             * smaller at this point.  It is certainly not zero.  Check for a
             * non-zero fractional digit:
             */
            if (first <= 5)
            {
               unsigned int i;
               *ascii++ = 46; /* decimal point */
               /* ndigits may be <5 for small numbers, output leading zeros
                * then ndigits digits to first:
                */
               i = 5;
               while (ndigits < i)
               {
                  *ascii++ = 48; --i;
               }
               while (ndigits >= first) *ascii++ = digits[--ndigits];
               /* Don't output the trailing zeros! */
            }
         }
         else
            *ascii++ = 48;

         /* And null terminate the string: */
         *ascii = 0;
         return;
      }
   }

   /* Here on buffer too small. */
   png_error(png_ptr, "ASCII conversion buffer too small");
}